

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

int pg::ceil_log2(unsigned_long_long x)

{
  int local_24;
  int local_1c;
  int k;
  int i;
  int j;
  int y;
  unsigned_long_long x_local;
  
  i = (int)((x & x - 1) != 0);
  k = 0x20;
  _j = x;
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    if ((_j & ceil_log2::t[local_1c]) == 0) {
      local_24 = 0;
    }
    else {
      local_24 = k;
    }
    i = local_24 + i;
    _j = _j >> (sbyte)local_24;
    k = k >> 1;
  }
  return i;
}

Assistant:

static int
ceil_log2(unsigned long long x)
{
    static const unsigned long long t[6] = {
        0xFFFFFFFF00000000ull,
        0x00000000FFFF0000ull,
        0x000000000000FF00ull,
        0x00000000000000F0ull,
        0x000000000000000Cull,
        0x0000000000000002ull
    };

    int y = (((x & (x - 1)) == 0) ? 0 : 1);
    int j = 32;
    int i;

    for (i = 0; i < 6; i++) {
        int k = (((x & t[i]) == 0) ? 0 : j);
        y += k;
        x >>= k;
        j >>= 1;
    }

    return y;
}